

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.h
# Opt level: O2

char * __thiscall Fl_Comment_Type::title(Fl_Comment_Type *this)

{
  char cVar1;
  char *pcVar2;
  undefined4 extraout_var;
  char *s;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  
  pcVar3 = (this->super_Fl_Type).name_;
  if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
    iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[5])();
    return (char *)CONCAT44(extraout_var,iVar5);
  }
  pcVar4 = this->title_buf;
  pcVar2 = pcVar4;
  if (this->title_buf[0] != '\0') {
    return pcVar2;
  }
  iVar5 = 0x32;
  while (1 < iVar5) {
    cVar1 = *pcVar3;
    pcVar3 = pcVar3 + 1;
    if (cVar1 == '\n') {
      pcVar4[0] = '\\';
      pcVar4[1] = 'n';
LAB_0017d375:
      pcVar4 = pcVar4 + 2;
      iVar5 = iVar5 + -2;
    }
    else {
      if (cVar1 == '\r') {
        pcVar4[0] = '\\';
        pcVar4[1] = 'r';
        goto LAB_0017d375;
      }
      if (cVar1 == '\0') goto LAB_0017d395;
      if (cVar1 < ' ') {
        *pcVar4 = '^';
        pcVar4[1] = cVar1 + 'A';
        goto LAB_0017d375;
      }
      iVar5 = iVar5 + -1;
      *pcVar4 = cVar1;
      pcVar4 = pcVar4 + 1;
    }
  }
  pcVar4[0] = '.';
  pcVar4[1] = '.';
  pcVar4[2] = '.';
  pcVar4 = pcVar4 + 3;
LAB_0017d395:
  *pcVar4 = '\0';
  return pcVar2;
}

Assistant:

const char *name() const {return name_;}